

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_12e14a::CreateLoad
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,uint offset)

{
  uint uVar1;
  ulong uVar2;
  Allocator *pAVar3;
  VariableData *pVVar4;
  VmConstant **ppVVar5;
  int iVar6;
  VmInstructionType VVar7;
  VmConstant *pVVar8;
  undefined4 extraout_var;
  VmInstruction *pVVar10;
  TypeBase *pTVar11;
  SynBase *source_00;
  undefined1 auVar12 [16];
  VmType VVar13;
  int in_stack_ffffffffffffffa8;
  VmConstant *pVVar9;
  
  uVar2 = type->size;
  if (uVar2 == 0) {
    pVVar8 = CreateConstantStruct(ctx->allocator,source,(char *)0x0,0,type);
    return &pVVar8->super_VmValue;
  }
  if (0x40 < (long)uVar2) {
    pVVar8 = CreateAlloca(ctx,module,source,type,"spill",true);
    CreateMemCopy(module,source,&pVVar8->super_VmValue,0,address,(uint)type->size,
                  in_stack_ffffffffffffffa8);
    iVar6 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    pVVar9 = (VmConstant *)CONCAT44(extraout_var,iVar6);
    pAVar3 = ctx->allocator;
    VVar13 = GetVmType(ctx,type);
    (pVVar9->super_VmValue).typeID = 1;
    (pVVar9->super_VmValue).type = VVar13;
    (pVVar9->super_VmValue).source = source;
    (pVVar9->super_VmValue).comment.begin = (char *)0x0;
    (pVVar9->super_VmValue).comment.end = (char *)0x0;
    (pVVar9->super_VmValue).users.allocator = pAVar3;
    (pVVar9->super_VmValue).users.data = (pVVar9->super_VmValue).users.little;
    (pVVar9->super_VmValue).users.count = 0;
    (pVVar9->super_VmValue).users.max = 8;
    (pVVar9->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar9->super_VmValue).hasSideEffects = false;
    (pVVar9->super_VmValue).hasMemoryAccess = false;
    (pVVar9->super_VmValue).canBeRemoved = true;
    (pVVar9->super_VmValue).hasKnownSimpleUse = false;
    (pVVar9->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00241d38;
    pVVar9->iValue = 0;
    pVVar9->dValue = 0.0;
    pVVar9->lValue = 0;
    pVVar9->sValue = (char *)0x0;
    pVVar9->bValue = (VmBlock *)0x0;
    pVVar9->fValue = (VmFunction *)0x0;
    pVVar9->container = (VariableData *)0x0;
    pVVar9->isFloat = false;
    pVVar9->isReference = false;
    pVVar9->iValue = pVVar8->iValue;
    pVVar4 = pVVar8->container;
    pVVar9->container = pVVar4;
    pVVar9->isReference = true;
    uVar1 = (pVVar4->users).count;
    if (uVar1 == (pVVar4->users).max) {
      SmallArray<VmConstant_*,_8U>::grow(&pVVar4->users,uVar1);
    }
    ppVVar5 = (pVVar4->users).data;
    if (ppVVar5 != (VmConstant **)0x0) {
      uVar1 = (pVVar4->users).count;
      (pVVar4->users).count = uVar1 + 1;
      ppVVar5[uVar1] = pVVar9;
      return &pVVar9->super_VmValue;
    }
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                 );
  }
  auVar12._0_4_ = -(uint)(type == ctx->typeBool);
  auVar12._4_4_ = -(uint)(type == ctx->typeChar);
  auVar12._8_4_ = -(uint)(type == ctx->typeShort);
  auVar12._12_4_ = -(uint)(type == ctx->typeInt);
  iVar6 = movmskps((int)source,auVar12);
  if (iVar6 != 0) {
    source_00 = (SynBase *)0x400000001;
    pTVar11 = (TypeBase *)0x0;
    goto LAB_001a6a3c;
  }
  source_00 = (SynBase *)0x800000002;
  if (ctx->typeFloat == type) goto LAB_001a6b7e;
  pTVar11 = (TypeBase *)0x0;
  if (ctx->typeDouble == type) goto LAB_001a6a3c;
  if (ctx->typeLong == type) {
    source_00 = (SynBase *)0x800000003;
    pTVar11 = (TypeBase *)0x0;
    goto LAB_001a6a3c;
  }
  uVar1 = type->typeID;
  pTVar11 = type;
  if (uVar1 == 0x12) {
LAB_001a6b54:
    source_00 = (SynBase *)0x800000006;
  }
  else {
    if (uVar1 == 0x14) {
      source_00 = (SynBase *)0xc00000008;
      goto LAB_001a6a3c;
    }
    if (uVar1 == 0x15) {
      source_00 = (SynBase *)0xc00000007;
      goto LAB_001a6a3c;
    }
    if (ctx->typeAutoRef == (TypeStruct *)type) {
      source_00 = (SynBase *)0xc00000009;
    }
    else if (ctx->typeAutoArray == (TypeStruct *)type) {
      source_00 = (SynBase *)0x100000000a;
    }
    else {
      if (1 < uVar1 - 9) {
        if (uVar1 != 0xb) {
          source_00 = (SynBase *)0x400000001;
          pTVar11 = (TypeBase *)0x0;
          if (uVar1 != 0x19) {
            if ((uVar2 & 3) != 0) {
              __assert_fail("type->size % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1e2,
                            "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                           );
            }
            if (uVar2 >> 0x20 != 0) {
              __assert_fail("unsigned(size) == size",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                            ,0xe2,"static const VmType VmType::Struct(long long, TypeBase *)");
            }
            source_00 = (SynBase *)(uVar2 << 0x20 | 0xb);
            pTVar11 = type;
          }
          goto LAB_001a6a3c;
        }
        goto LAB_001a6b54;
      }
      source_00 = (SynBase *)0x400000001;
    }
LAB_001a6b7e:
    pTVar11 = (TypeBase *)0x0;
  }
LAB_001a6a3c:
  VVar7 = GetLoadInstruction(ctx,type);
  pVVar8 = CreateConstantInt(ctx->allocator,source,0);
  VVar13.structType._0_4_ = VVar7;
  VVar13._0_8_ = pTVar11;
  VVar13.structType._4_4_ = 0;
  pVVar10 = CreateInstruction((anon_unknown_dwarf_12e14a *)module,(VmModule *)source,source_00,
                              VVar13,(VmInstructionType)address,&pVVar8->super_VmValue,
                              (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,address);
  return &pVVar10->super_VmValue;
}

Assistant:

VmValue* CreateLoad(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, unsigned offset)
	{
		if(type->size == 0)
			return CreateConstantStruct(ctx.allocator, source, NULL, 0, type);

		if(type->size > spillTypeSize)
		{
			VmConstant *spill = CreateAlloca(ctx, module, source, type, "spill", true);

			CreateMemCopy(module, source, spill, 0, address, offset, (int)type->size);

			VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, type), source);

			reference->iValue = spill->iValue;
			reference->container = spill->container;
			reference->isReference = true;

			reference->container->users.push_back(reference);

			return reference;
		}

		return CreateInstruction(module, source, GetLoadResultType(ctx, type), GetLoadInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset));
	}